

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O1

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::Denamespace
          (string *__return_storage_ptr__,NimBfbsGenerator *this,string *s,string *importns,
          string *ns)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  const_iterator cVar4;
  long *plVar5;
  size_type *psVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(anonymous_namespace)::builtin_types_abi_cxx11_,s);
  if (cVar4._M_node == (_Base_ptr)((anonymous_namespace)::builtin_types_abi_cxx11_ + 8)) {
    Namer::Denamespace(&local_70,&(this->namer_).super_Namer,s,ns,'.');
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (__return_storage_ptr__,&this->namer_,&local_70,
               (ulong)(this->namer_).super_Namer.config_.types);
    paVar1 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    sVar3 = ns->_M_string_length;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    if (sVar3 == 0) {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    }
    else {
      local_50[0] = local_40;
      pcVar2 = (ns->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar2,pcVar2 + sVar3);
      std::__cxx11::string::append((char *)local_50);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                                 );
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = plVar5[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
    }
    std::__cxx11::string::operator=((string *)importns,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((sVar3 != 0) && (local_50[0] != local_40)) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    sVar3 = importns->_M_string_length;
    if (sVar3 != 0) {
      pcVar2 = (importns->_M_dataplus)._M_p;
      sVar7 = 0;
      do {
        if (pcVar2[sVar7] == '.') {
          pcVar2[sVar7] = '_';
        }
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(const std::string &s, std::string &importns,
                          std::string &ns) const {
    if (builtin_types.find(s) != builtin_types.end()) { return s; }
    std::string type = namer_.Type(namer_.Denamespace(s, ns));
    importns = ns.empty() ? type : ns + "." + type;
    std::replace(importns.begin(), importns.end(), '.', '_');
    return type;
  }